

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::transformed_draw_extra
          (Fl_PostScript_Graphics_Driver *this,char *str,int n,double x,double y,int w,bool rtl)

{
  uint uVar1;
  bool bVar2;
  Fl_Graphics_Driver *pFVar3;
  char *pcVar4;
  int iVar5;
  Fl_Color FVar6;
  Fl_Display_Device *pFVar7;
  uchar *puVar8;
  uchar *puVar9;
  void *data;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  undefined7 in_register_00000081;
  byte bVar16;
  long lVar17;
  uint uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float fVar19;
  uchar blue;
  uchar green;
  uchar red;
  uchar local_a3;
  uchar local_a2;
  uchar local_a1;
  byte *local_a0;
  ulong local_98;
  ulong local_90;
  Fl_Color local_88;
  undefined4 local_84;
  uint local_80;
  int local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  Fl_Surface_Device *local_68;
  Window local_60;
  Window local_58;
  char *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000081,rtl);
  local_a0 = (byte *)CONCAT44(local_a0._4_4_,n);
  local_90 = CONCAT44(local_90._4_4_,(this->super_Fl_Graphics_Driver).size_);
  local_98 = CONCAT44(local_98._4_4_,(this->super_Fl_Graphics_Driver).font_);
  local_7c = w;
  local_50 = str;
  local_40 = x;
  local_38 = y;
  iVar5 = (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x3a])();
  _local_78 = ZEXT416((uint)(float)iVar5);
  local_80 = (uint)(float)iVar5;
  uVar1 = (this->super_Fl_Graphics_Driver).color_;
  FVar6 = fl_contrast(0xff,uVar1);
  iVar5 = (int)(float)local_78._0_4_;
  local_78._4_4_ = (float)(int)(float)local_78._4_4_;
  local_78._0_4_ = (float)iVar5;
  fStack_70 = (float)(int)fStack_70;
  fStack_6c = (float)(int)fStack_6c;
  uVar18 = (uint)((float)iVar5 + 3.0);
  local_58 = XCreatePixmap(fl_display,
                           *(undefined8 *)
                            (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                           (int)((double)w * 1.5),uVar18,fl_visual->depth);
  local_60 = fl_window;
  local_68 = Fl_Surface_Device::_surface;
  fl_window = local_58;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    local_68 = Fl_Surface_Device::default_surface();
  }
  pFVar7 = Fl_Display_Device::display_device();
  (*(pFVar7->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar7);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  local_88 = FVar6;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,0,0,(ulong)(uint)(int)((double)w * 1.5),(ulong)uVar18);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)uVar1);
  uVar11 = local_98;
  pFVar3 = fl_graphics_driver;
  fl_graphics_driver->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
  (*(pFVar3->super_Fl_Device)._vptr_Fl_Device[0x36])(pFVar3,local_98 & 0xffffffff,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,uVar11 & 0xffffffff,(ulong)(uint)(int)(float)(int)local_90);
  pcVar4 = local_50;
  pbVar12 = local_a0;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,local_50,(ulong)local_a0 & 0xffffffff);
  uVar1 = local_80;
  uVar18 = (uint)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_48 = (double)(int)local_80;
  uVar11 = 1;
  if ((byte)local_84 != 0) {
    uVar11 = (ulong)uVar18;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(byte)local_84 * 2 + 0xe])
            (fl_graphics_driver,pcVar4,(ulong)pbVar12 & 0xffffffff,uVar11,
             (ulong)(uint)(int)(local_48 * 0.8));
  puVar8 = fl_read_image((uchar *)0x0,1,1,uVar18,uVar1,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = local_60;
  (*(local_68->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
            (this,local_98 & 0xffffffff,local_90 & 0xffffffff);
  XFreePixmap(fl_display,local_58);
  Fl::get_color(local_88,&local_a1,&local_a2,&local_a3);
  iVar5 = uVar18 + 0xe;
  if (-1 < (int)(uVar18 + 7)) {
    iVar5 = uVar18 + 7;
  }
  iVar5 = iVar5 >> 3;
  local_a0 = (byte *)operator_new__((long)(int)(iVar5 * uVar1));
  puVar9 = puVar8;
  pbVar12 = local_a0;
  uVar10 = uVar1;
  if (0 < (int)uVar1) {
    do {
      if ((int)uVar18 < 1) {
        bVar14 = 0;
        bVar2 = true;
      }
      else {
        bVar16 = 0x80;
        bVar14 = 0;
        uVar15 = uVar18;
        do {
          if (((*puVar9 != local_a1) || (puVar9[1] != local_a2)) || (puVar9[2] != local_a3)) {
            bVar14 = bVar14 | bVar16;
          }
          if (bVar16 < 2) {
            *pbVar12 = bVar14;
            pbVar12 = pbVar12 + 1;
            bVar16 = 0x80;
            bVar14 = 0;
          }
          else {
            bVar16 = bVar16 >> 1;
          }
          puVar9 = puVar9 + 3;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        bVar2 = false;
      }
      if (!bVar2) {
        *pbVar12 = bVar14;
        pbVar12 = pbVar12 + 1;
      }
      bVar2 = 1 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
  }
  if (puVar8 != (uchar *)0x0) {
    operator_delete__(puVar8);
  }
  fVar19 = (float)(int)uVar18 / (float)local_7c;
  local_90 = (ulong)uVar18;
  clocale_printf(this,"%g %g %g %g %d %d MI\n",SUB84(local_40,0),
                 SUB84(local_38 + (local_48 * -0.77) / (double)fVar19,0),
                 (double)((float)(int)uVar18 / fVar19),(double)((float)local_78._0_4_ / fVar19),
                 (ulong)uVar18,(ulong)uVar1);
  data = prepare_rle85(this);
  if (0 < (int)uVar1) {
    iVar13 = 1;
    if (1 < iVar5) {
      iVar13 = iVar5;
    }
    pbVar12 = local_a0 + ((ulong)uVar1 - 1) * (long)iVar5;
    local_98 = -(long)iVar5;
    uVar11 = (ulong)uVar1;
    do {
      if (0 < (int)local_90) {
        lVar17 = 0;
        do {
          write_rle85(this,pbVar12[lVar17],data);
          lVar17 = lVar17 + 1;
        } while (iVar13 != (int)lVar17);
      }
      pbVar12 = pbVar12 + local_98;
      bVar2 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar2);
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  operator_delete__(local_a0);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::transformed_draw_extra(const char* str, int n, double x, double y, int w, bool rtl)
{
  // scale for bitmask computation
#if defined(USE_X11) && !USE_XFT
  float scale = 1; // don't scale because we can't expect to have scalable fonts
#else
  float scale = 2;
#endif
  Fl_Fontsize old_size = size();
  Fl_Font fontnum = Fl_Graphics_Driver::font();
  int w_scaled =  (int)(w * (scale + 0.5));
  int h = (int)(height() * scale);
  // create an offscreen image of the string
  Fl_Color text_color = Fl_Graphics_Driver::color();
  Fl_Color bg_color = fl_contrast(FL_WHITE, text_color);
  Fl_Offscreen off = fl_create_offscreen(w_scaled, (int)(h+3*scale) );
  fl_begin_offscreen(off);
  fl_color(bg_color);
  // color offscreen background with a shade contrasting with the text color
  fl_rectf(0, 0, w_scaled, (int)(h+3*scale) );
  fl_color(text_color);
#if defined(USE_X11) && !USE_XFT
  // force seeing this font as new so it's applied to the offscreen graphics context
  fl_graphics_driver->font_descriptor(NULL);
  fl_font(fontnum, 0);
#endif
  fl_font(fontnum, (Fl_Fontsize)(scale * old_size) );
  int w2 = (int)fl_width(str, n);
  // draw string in offscreen
  if (rtl) fl_rtl_draw(str, n, w2, (int)(h * 0.8) );
  else fl_draw(str, n, 1, (int)(h * 0.8) );
  // read (most of) the offscreen image
  uchar *img = fl_read_image(NULL, 1, 1, w2, h, 0);
  fl_end_offscreen();
  font(fontnum, old_size);
  fl_delete_offscreen(off);
  // compute the mask of what is not the background
  uchar *mask = calc_mask(img, w2, h, bg_color);
  delete[] img;
  // write the string image to PostScript as a scaled bitmask
  scale = w2 / float(w);
  clocale_printf("%g %g %g %g %d %d MI\n", x, y - h*0.77/scale, w2/scale, h/scale, w2, h);
  uchar *di;
  int wmask = (w2+7)/8;
  void *rle85 = prepare_rle85();
  for (int j = h - 1; j >= 0; j--){
    di = mask + j * wmask;
    for (int i = 0; i < wmask; i++){
      write_rle85(*di, rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  delete[] mask;
}